

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalVector.hpp
# Opt level: O0

void __thiscall
limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::reserve
          (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *this,size_t size)

{
  void *__src;
  void *pvVar1;
  ulong in_RSI;
  void *in_RDI;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *old;
  pair<unsigned_long,_const_cppjieba::DictUnit_*> *next;
  
  if (*(ulong *)((long)in_RDI + 0x110) < in_RSI) {
    pvVar1 = malloc(in_RSI << 4);
    if (pvVar1 == (void *)0x0) {
      __assert_fail("next",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/deps/limonp/LocalVector.hpp"
                    ,0x5c,
                    "void limonp::LocalVector<std::pair<unsigned long, const cppjieba::DictUnit *>>::reserve(size_t) [T = std::pair<unsigned long, const cppjieba::DictUnit *>]"
                   );
    }
    __src = *(void **)((long)in_RDI + 0x100);
    *(void **)((long)in_RDI + 0x100) = pvVar1;
    memcpy(*(void **)((long)in_RDI + 0x100),__src,*(long *)((long)in_RDI + 0x110) << 4);
    *(ulong *)((long)in_RDI + 0x110) = in_RSI;
    if (__src != in_RDI) {
      free(__src);
    }
  }
  return;
}

Assistant:

void reserve(size_t size) {
    if(size <= capacity_) {
      return;
    }
    T * next =  (T*)malloc(sizeof(T) * size);
    assert(next);
    T * old = ptr_;
    ptr_ = next;
    memcpy(ptr_, old, sizeof(T) * capacity_);
    capacity_ = size;
    if(old != buffer_) {
      free(old);
    }
  }